

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::GetMatrixTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *num_rows,uint32_t *num_cols,
          uint32_t *column_type,uint32_t *component_type)

{
  pointer puVar1;
  pointer puVar2;
  Instruction *pIVar3;
  bool bVar4;
  
  if (id == 0) {
    bVar4 = false;
  }
  else {
    pIVar3 = FindDef(this,id);
    if (pIVar3 == (Instruction *)0x0) {
      __assert_fail("mat_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x47e,
                    "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                   );
    }
    bVar4 = (pIVar3->inst_).opcode == 0x18;
    if (bVar4) {
      puVar1 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pIVar3 = FindDef(this,puVar1[2]);
      if (pIVar3 == (Instruction *)0x0) {
        __assert_fail("vec_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x483,
                      "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                     );
      }
      if ((pIVar3->inst_).opcode != 0x17) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x486,
                      "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                     );
      }
      *num_cols = puVar1[3];
      puVar2 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *num_rows = puVar2[3];
      *column_type = puVar1[2];
      *component_type = puVar2[2];
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool ValidationState_t::GetMatrixTypeInfo(uint32_t id, uint32_t* num_rows,
                                          uint32_t* num_cols,
                                          uint32_t* column_type,
                                          uint32_t* component_type) const {
  if (!id) return false;

  const Instruction* mat_inst = FindDef(id);
  assert(mat_inst);
  if (mat_inst->opcode() != spv::Op::OpTypeMatrix) return false;

  const uint32_t vec_type = mat_inst->word(2);
  const Instruction* vec_inst = FindDef(vec_type);
  assert(vec_inst);

  if (vec_inst->opcode() != spv::Op::OpTypeVector) {
    assert(0);
    return false;
  }

  *num_cols = mat_inst->word(3);
  *num_rows = vec_inst->word(3);
  *column_type = mat_inst->word(2);
  *component_type = vec_inst->word(2);

  return true;
}